

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

int __thiscall deqp::egl::SharingTests::init(SharingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  TestCaseGroup *pTVar2;
  GLES2SharingTest *pGVar3;
  GLES2TextureSharingTest *pGVar4;
  TestNode *node;
  TestSpec local_44;
  TestCaseGroup *local_38;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"gles2","OpenGL ES 2 sharing test");
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"context",
             "Context creation and destruction tests");
  local_44.destroyContextBFirst = false;
  local_44.useResource = false;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = true;
  local_44.renderOnContexB = true;
  local_44.verifyOnContexA = true;
  local_44.verifyOnContexB = true;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ac8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_destroy",
             "Simple context creation and destruction",&local_44);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = true;
  local_44.useResource = false;
  local_44.destroyOnContexB = false;
  local_44.initializeData = false;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ac8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_destroy_mixed",
             "Simple context creation and destruction test with different destruction order",
             &local_44);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"buffer",
             "Buffer creation, destruction and rendering test");
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ae8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2BufferSharingTest_0210d590;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = true;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ae8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delet on different contexts",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2BufferSharingTest_0210d590;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = true;
  local_44.renderOnContexB = true;
  local_44.verifyOnContexA = true;
  local_44.verifyOnContexB = true;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ae8);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, rendering on two different contexts and delete",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2BufferSharingTest_0210d590;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"texture",
             "Texture creation, destruction and rendering tests");
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",&local_44);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar4);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = true;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delete on different contexts",&local_44);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar4);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = true;
  local_44.renderOnContexB = true;
  local_44.verifyOnContexA = true;
  local_44.verifyOnContexB = true;
  pGVar4 = (GLES2TextureSharingTest *)operator_new(0x1b20);
  GLES2TextureSharingTest::GLES2TextureSharingTest
            (pGVar4,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, render in two contexts and delete",&local_44);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar4);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"program",
             "Program creation, destruction and rendering test");
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete",
             "Create and delete on shared context",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d630;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = true;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed",
             "Create and delete on different contexts",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d630;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = true;
  local_44.renderOnContexB = true;
  local_44.verifyOnContexA = true;
  local_44.verifyOnContexB = true;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"render",
             "Create, render in two contexts and delete",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d630;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_eglTestCtx,"shader",
             "Shader creation, destruction and rendering test");
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  local_38 = pTVar1;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_vert",
             "Create and delete on shared context",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d680;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8b3100000000;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = true;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed_vert",
             "Create and delete on different contexts",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d680;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8b3100000000;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = true;
  local_44.renderOnContexB = true;
  local_44.verifyOnContexA = true;
  local_44.verifyOnContexB = true;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"render_vert",
             "Create, render on two contexts and delete",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d680;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8b3100000000;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_frag",
             "Create and delete on shared context",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d680;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8b3000000000;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = true;
  local_44.initializeData = true;
  local_44.renderOnContexA = false;
  local_44.renderOnContexB = false;
  local_44.verifyOnContexA = false;
  local_44.verifyOnContexB = false;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"create_delete_mixed_frag",
             "Create and delete on different contexts",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d680;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8b3000000000;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  local_44.destroyContextBFirst = false;
  local_44.useResource = true;
  local_44.destroyOnContexB = false;
  local_44.initializeData = true;
  local_44.renderOnContexA = true;
  local_44.renderOnContexB = true;
  local_44.verifyOnContexA = true;
  local_44.verifyOnContexB = true;
  pGVar3 = (GLES2SharingTest *)operator_new(0x1ad0);
  GLES2SharingTest::GLES2SharingTest
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"render_frag",
             "Create, render on two contexts and delete",&local_44);
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingTest_0210d680;
  pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8b3000000000;
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pGVar3);
  pTVar1 = local_38;
  tcu::TestNode::addChild((TestNode *)local_38,(TestNode *)pTVar2);
  node = (TestNode *)operator_new(0x78);
  GLES2SharingThreadedTests::GLES2SharingThreadedTests
            ((GLES2SharingThreadedTests *)node,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)pTVar1,node);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void SharingTests::init (void)
{
	TestCaseGroup* gles2 = new TestCaseGroup(m_eglTestCtx, "gles2", "OpenGL ES 2 sharing test");

	TestCaseGroup* context = new TestCaseGroup(m_eglTestCtx, "context", "Context creation and destruction tests");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= false;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		context->addChild(new GLES2SharingTest(m_eglTestCtx, "create_destroy", "Simple context creation and destruction", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= true;
		spec.useResource			= false;
		spec.destroyOnContexB		= false;
		spec.initializeData			= false;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		context->addChild(new GLES2SharingTest(m_eglTestCtx, "create_destroy_mixed", "Simple context creation and destruction test with different destruction order", spec));
	}

	gles2->addChild(context);

	TestCaseGroup* buffer = new TestCaseGroup(m_eglTestCtx, "buffer", "Buffer creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delet on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		buffer->addChild(new GLES2BufferSharingTest(m_eglTestCtx, "render", "Create, rendering on two different contexts and delete", spec));
	}

	gles2->addChild(buffer);

	TestCaseGroup* texture = new TestCaseGroup(m_eglTestCtx, "texture", "Texture creation, destruction and rendering tests");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delete on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		texture->addChild(new GLES2TextureSharingTest(m_eglTestCtx, "render", "Create, render in two contexts and delete", spec));
	}

	gles2->addChild(texture);

	TestCaseGroup* program = new TestCaseGroup(m_eglTestCtx, "program", "Program creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "create_delete", "Create and delete on shared context", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "create_delete_mixed", "Create and delete on different contexts", spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		program->addChild(new GLES2ProgramSharingTest(m_eglTestCtx, "render", "Create, render in two contexts and delete", spec));
	}

	gles2->addChild(program);

	TestCaseGroup* shader = new TestCaseGroup(m_eglTestCtx, "shader", "Shader creation, destruction and rendering test");

	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_vert", "Create and delete on shared context", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_mixed_vert", "Create and delete on different contexts", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "render_vert", "Create, render on two contexts and delete", GL_VERTEX_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_frag", "Create and delete on shared context", GL_FRAGMENT_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= true;
		spec.initializeData			= true;
		spec.renderOnContexA		= false;
		spec.renderOnContexB		= false;
		spec.verifyOnContexA		= false;
		spec.verifyOnContexB		= false;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "create_delete_mixed_frag", "Create and delete on different contexts", GL_FRAGMENT_SHADER, spec));
	}
	{
		GLES2SharingTest::TestSpec spec;
		spec.destroyContextBFirst	= false;
		spec.useResource			= true;
		spec.destroyOnContexB		= false;
		spec.initializeData			= true;
		spec.renderOnContexA		= true;
		spec.renderOnContexB		= true;
		spec.verifyOnContexA		= true;
		spec.verifyOnContexB		= true;

		shader->addChild(new GLES2ShaderSharingTest(m_eglTestCtx, "render_frag", "Create, render on two contexts and delete", GL_FRAGMENT_SHADER, spec));
	}


	gles2->addChild(shader);


	gles2->addChild(new GLES2SharingThreadedTests(m_eglTestCtx));

	addChild(gles2);
}